

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O3

int CfdCheckTweakAddFromSchnorrPubkey
              (void *handle,char *tweaked_pubkey,bool tweaked_parity,char *base_pubkey,char *tweak)

{
  pointer pcVar1;
  bool bVar2;
  CfdException *pCVar3;
  int iVar4;
  SchnorrPubkey base_pubkey_obj;
  SchnorrPubkey pubkey_obj;
  ByteData256 tweak_obj;
  allocator local_99;
  undefined1 local_98 [32];
  SchnorrPubkey local_78;
  SchnorrPubkey local_60;
  ByteData256 local_48;
  
  cfd::Initialize();
  bVar2 = cfd::capi::IsEmptyString(tweaked_pubkey);
  if (bVar2) {
    local_98._0_8_ = "cfdcapi_key.cpp";
    local_98._8_4_ = 0x23f;
    local_98._16_8_ = "CfdCheckTweakAddFromSchnorrPubkey";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_98,kCfdLogLevelWarning,"tweak pubkey is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,"Failed to parameter. tweak pubkey is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_98);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar2 = cfd::capi::IsEmptyString(base_pubkey);
  if (!bVar2) {
    bVar2 = cfd::capi::IsEmptyString(tweak);
    if (!bVar2) {
      std::__cxx11::string::string((string *)local_98,tweak,(allocator *)&local_60);
      cfd::core::ByteData256::ByteData256(&local_48,(string *)local_98);
      pcVar1 = local_98 + 0x10;
      if ((pointer)local_98._0_8_ != pcVar1) {
        operator_delete((void *)local_98._0_8_);
      }
      std::__cxx11::string::string((string *)local_98,tweaked_pubkey,(allocator *)&local_78);
      cfd::core::SchnorrPubkey::SchnorrPubkey(&local_60,(string *)local_98);
      if ((pointer)local_98._0_8_ != pcVar1) {
        operator_delete((void *)local_98._0_8_);
      }
      std::__cxx11::string::string((string *)local_98,base_pubkey,&local_99);
      cfd::core::SchnorrPubkey::SchnorrPubkey(&local_78,(string *)local_98);
      if ((pointer)local_98._0_8_ != pcVar1) {
        operator_delete((void *)local_98._0_8_);
      }
      bVar2 = cfd::core::SchnorrPubkey::IsTweaked(&local_60,&local_78,&local_48,tweaked_parity);
      iVar4 = 7;
      if (bVar2) {
        iVar4 = 0;
      }
      if (local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_60.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return iVar4;
    }
    local_98._0_8_ = "cfdcapi_key.cpp";
    local_98._8_4_ = 0x24b;
    local_98._16_8_ = "CfdCheckTweakAddFromSchnorrPubkey";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_98,kCfdLogLevelWarning,"tweak is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,"Failed to parameter. tweak is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_98);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_98._0_8_ = "cfdcapi_key.cpp";
  local_98._8_4_ = 0x245;
  local_98._16_8_ = "CfdCheckTweakAddFromSchnorrPubkey";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_98,kCfdLogLevelWarning,"pubkey is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_98._0_8_ = local_98 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,"Failed to parameter. pubkey is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_98);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdCheckTweakAddFromSchnorrPubkey(
    void* handle, const char* tweaked_pubkey, bool tweaked_parity,
    const char* base_pubkey, const char* tweak) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(tweaked_pubkey)) {
      warn(CFD_LOG_SOURCE, "tweak pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tweak pubkey is null or empty.");
    }
    if (IsEmptyString(base_pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }
    if (IsEmptyString(tweak)) {
      warn(CFD_LOG_SOURCE, "tweak is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tweak is null or empty.");
    }

    ByteData256 tweak_obj = ByteData256(std::string(tweak));
    SchnorrPubkey pubkey_obj = SchnorrPubkey(std::string(tweaked_pubkey));
    SchnorrPubkey base_pubkey_obj = SchnorrPubkey(std::string(base_pubkey));
    bool is_tweaked =
        pubkey_obj.IsTweaked(base_pubkey_obj, tweak_obj, tweaked_parity);
    if (!is_tweaked) {
      return CfdErrorCode::kCfdSignVerificationError;
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}